

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O0

void Ptex::v2_2::anon_unknown_2::ApplyN<unsigned_short>
               (PtexTriangleKernelIter *k,float *result,void *data,int nChan,int nTxChan)

{
  int in_ECX;
  long in_RDX;
  float *in_RSI;
  int *in_RDI;
  int in_R8D;
  float weight;
  unsigned_short *pEnd;
  unsigned_short *p;
  float Q;
  float DQ;
  float V;
  float U;
  int x2;
  int x1;
  int xw;
  int vi;
  float DDQ;
  VecAccumN<unsigned_short> local_5d;
  float local_5c;
  unsigned_short *local_58;
  unsigned_short *local_50;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  float local_24;
  int local_20;
  int local_1c;
  long local_18;
  float *local_10;
  int *local_8;
  
  local_24 = (float)in_RDI[9] * 2.0;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_28 = in_RDI[4]; local_28 != local_8[7]; local_28 = local_28 + 1) {
    local_2c = *local_8 - local_28;
    local_30 = PtexUtils::max<int>(local_8[3],local_2c - local_8[8]);
    local_34 = PtexUtils::min<int>(local_8[6],local_2c - local_8[5]);
    local_38 = (float)local_30 - (float)local_8[1];
    local_3c = (float)local_28 - (float)local_8[2];
    local_40 = (float)local_8[9] * (local_38 + local_38 + 1.0) + (float)local_8[10] * local_3c;
    local_44 = (float)local_8[9] * local_38 * local_38 +
               ((float)local_8[10] * local_38 + (float)local_8[0xb] * local_3c) * local_3c;
    local_50 = (unsigned_short *)
               (local_18 + (long)((local_28 * *local_8 + local_30) * local_20) * 2);
    local_58 = local_50 + (local_34 - local_30) * local_20;
    for (; local_50 < local_58; local_50 = local_50 + local_20) {
      if (local_44 < 1.0) {
        local_5c = gaussian(0.0);
        local_5c = local_5c * (float)local_8[0xd];
        local_8[0xe] = (int)(local_5c + (float)local_8[0xe]);
        PtexUtils::VecAccumN<unsigned_short>::operator()
                  (&local_5d,local_10,local_50,local_1c,local_5c);
      }
      local_44 = local_40 + local_44;
      local_40 = local_24 + local_40;
    }
  }
  return;
}

Assistant:

void ApplyN(PtexTriangleKernelIter& k, float* result, void* data, int nChan, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccumN<T>()(result, p, nChan, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }